

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,QLatin1StringView key)

{
  QCborContainerPrivate *pQVar1;
  QCborContainerPrivate *pQVar2;
  char *in_RCX;
  QLatin1String key_00;
  QCborValueConstRef QVar3;
  
  key_00.m_size = key.m_data;
  if (*(int *)(this + 0x10) != 0xa0) {
    if (*(int *)(this + 0x10) == 0x80) {
      convertArrayToMap((QCborContainerPrivate **)(this + 8));
    }
    else {
      pQVar1 = *(QCborContainerPrivate **)(this + 8);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      *(undefined4 *)(this + 0x10) = 0xa0;
      if (pQVar1 != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(pQVar1);
      }
    }
  }
  *(undefined4 *)(this + 0x10) = 0xa0;
  *(undefined8 *)this = 0xffffffffffffffff;
  key_00.m_data = in_RCX;
  QVar3 = (QCborValueConstRef)
          QCborContainerPrivate::findOrAddMapKey<QLatin1String>
                    (*(QCborContainerPrivate **)(this + 8),(QCborContainerPrivate *)key.m_size,
                     key_00);
  pQVar2 = QVar3.d;
  pQVar1 = *(QCborContainerPrivate **)(this + 8);
  if (pQVar1 != pQVar2) {
    if (pQVar1 != (QCborContainerPrivate *)0x0) {
      QCborContainerPrivate::deref(pQVar1);
    }
    if (pQVar2 != (QCborContainerPrivate *)0x0) {
      LOCK();
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *(QCborContainerPrivate **)(this + 8) = pQVar2;
  }
  return (QCborValueRef)QVar3;
}

Assistant:

QCborValueRef QCborValue::operator[](QLatin1StringView key)
{
    return QCborContainerPrivate::findOrAddMapKey(*this, key);
}